

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void putword(int offset,int data)

{
  int data_local;
  int offset_local;
  
  if ((bank < 0xf0) && (offset < 0x1fff)) {
    rom[bank][offset] = (uchar)data;
    map[bank][offset] = (char)section + (char)(page << 5);
    rom[bank][offset + 1] = (uchar)((uint)data >> 8);
    map[bank][offset + 1] = (char)section + (char)(page << 5);
    if (max_bank < bank) {
      max_bank = bank;
    }
  }
  return;
}

Assistant:

void
putword(int offset, int data)
{
	if (bank >= RESERVED_BANK)
		return;
	if (offset < 0x1FFF) {
		/* low byte */
		rom[bank][offset] = (data) & 0xFF;
		map[bank][offset] = section + (page << 5);

		/* high byte */
		rom[bank][offset+1] = (data >> 8) & 0xFF;
		map[bank][offset+1] = section + (page << 5);

		/* update rom size */
		if (bank > max_bank)
			max_bank = bank;
	}
}